

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator::GenerateEqualsCode
          (ImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  JavaType JVar1;
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  Printer *local_18;
  Printer *printer_local;
  ImmutablePrimitiveFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  JVar1 = GetJavaType(this->descriptor_);
  switch(JVar1) {
  case JAVATYPE_INT:
  case JAVATYPE_LONG:
  case JAVATYPE_BOOLEAN:
    io::Printer::Print(local_18,&this->variables_,
                       "if (get$capitalized_name$()\n    != other.get$capitalized_name$()) return false;\n"
                      );
    break;
  case JAVATYPE_FLOAT:
    io::Printer::Print(local_18,&this->variables_,
                       "if (java.lang.Float.floatToIntBits(get$capitalized_name$())\n    != java.lang.Float.floatToIntBits(\n        other.get$capitalized_name$())) return false;\n"
                      );
    break;
  case JAVATYPE_DOUBLE:
    io::Printer::Print(local_18,&this->variables_,
                       "if (java.lang.Double.doubleToLongBits(get$capitalized_name$())\n    != java.lang.Double.doubleToLongBits(\n        other.get$capitalized_name$())) return false;\n"
                      );
    break;
  case JAVATYPE_STRING:
  case JAVATYPE_BYTES:
    io::Printer::Print(local_18,&this->variables_,
                       "if (!get$capitalized_name$()\n    .equals(other.get$capitalized_name$())) return false;\n"
                      );
    break;
  case JAVATYPE_ENUM:
  case JAVATYPE_MESSAGE:
  default:
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_primitive_field.cc"
               ,0x1d6);
    other = internal::LogMessage::operator<<(&local_50,"Can\'t get here.");
    internal::LogFinisher::operator=(local_5d,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return;
}

Assistant:

void ImmutablePrimitiveFieldGenerator::GenerateEqualsCode(
    io::Printer* printer) const {
  switch (GetJavaType(descriptor_)) {
    case JAVATYPE_INT:
    case JAVATYPE_LONG:
    case JAVATYPE_BOOLEAN:
      printer->Print(variables_,
                     "if (get$capitalized_name$()\n"
                     "    != other.get$capitalized_name$()) return false;\n");
      break;

    case JAVATYPE_FLOAT:
      printer->Print(
          variables_,
          "if (java.lang.Float.floatToIntBits(get$capitalized_name$())\n"
          "    != java.lang.Float.floatToIntBits(\n"
          "        other.get$capitalized_name$())) return false;\n");
      break;

    case JAVATYPE_DOUBLE:
      printer->Print(
          variables_,
          "if (java.lang.Double.doubleToLongBits(get$capitalized_name$())\n"
          "    != java.lang.Double.doubleToLongBits(\n"
          "        other.get$capitalized_name$())) return false;\n");
      break;

    case JAVATYPE_STRING:
    case JAVATYPE_BYTES:
      printer->Print(
          variables_,
          "if (!get$capitalized_name$()\n"
          "    .equals(other.get$capitalized_name$())) return false;\n");
      break;

    case JAVATYPE_ENUM:
    case JAVATYPE_MESSAGE:
    default:
      GOOGLE_LOG(FATAL) << "Can't get here.";
      break;
  }
}